

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_test.cpp
# Opt level: O1

void __thiscall Pow2_Basics_Test::TestBody(Pow2_Basics_Test *this)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  uVar2 = 0;
  do {
    local_50.ptr_._0_1_ = 1;
    local_48.data_._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,bool>
              (local_40,"true","IsPowerOf2(ui)",(bool *)&local_50,(bool *)&local_48);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar3 = "";
      if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                 ,0x13,pcVar3);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (uVar2 != 0) {
      local_50.ptr_ = local_50.ptr_ & 0xffffffffffffff00;
      local_48.data_._0_1_ = 0;
      testing::internal::CmpHelperEQ<bool,bool>
                (local_40,"false","IsPowerOf2(ui + 1)",(bool *)&local_50,(bool *)&local_48);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        pcVar3 = "";
        if (local_38.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                   ,0x15,pcVar3);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_50.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_50.ptr_ + 8))();
          }
          local_50.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    if (1 < uVar2) {
      local_50.ptr_ = local_50.ptr_ & 0xffffffffffffff00;
      local_48.data_._0_1_ = POPCOUNT(-1 << (uVar2 & 0x1f)) == 0x1f;
      testing::internal::CmpHelperEQ<bool,bool>
                (local_40,"false","IsPowerOf2(ui - 1)",(bool *)&local_50,(bool *)&local_48);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        pcVar3 = "";
        if (local_38.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                   ,0x18,pcVar3);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_50.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_50.ptr_ + 8))();
          }
          local_50.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x20);
  return;
}

Assistant:

TEST(Pow2, Basics) {
    for (int i = 0; i < 32; ++i) {
        uint32_t ui = 1u << i;
        EXPECT_EQ(true, IsPowerOf2(ui));
        if (ui > 1) {
            EXPECT_EQ(false, IsPowerOf2(ui + 1));
        }
        if (ui > 2) {
            EXPECT_EQ(false, IsPowerOf2(ui - 1));
        }
    }
}